

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O3

void __thiscall amrex::Print::Print(Print *this,ostream *os_)

{
  long lVar1;
  
  lVar1 = DAT_0071a620;
  this->rank = *(int *)(DAT_0071a620 + -0x30);
  this->comm = *(MPI_Comm *)(lVar1 + -0x48);
  this->os = os_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->ss);
  *(undefined8 *)(&this->field_0x18 + *(long *)(*(long *)&this->ss + -0x18)) =
       *(undefined8 *)(this->os + *(long *)(*(long *)this->os + -0x18) + 8);
  return;
}

Assistant:

explicit Print (std::ostream& os_ = amrex::OutStream())
            : rank(ParallelContext::IOProcessorNumberSub())
            , comm(ParallelContext::CommunicatorSub())
            , os(os_)
            { ss.precision(os.precision()); }